

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

MQTTErrors mqtt_sync(mqtt_client *client)

{
  mqtt_pal_mutex_t *__mutex;
  MQTTErrors MVar1;
  ssize_t sVar2;
  bool bVar3;
  
  __mutex = &client->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  MVar1 = client->error;
  if (((MVar1 == MQTT_ERROR_RECONNECTING) || (MVar1 == MQTT_OK)) ||
     (client->reconnect_callback == (_func_void_mqtt_client_ptr_void_ptr_ptr *)0x0)) {
    bVar3 = MVar1 != MQTT_ERROR_RECONNECTING;
    if (!bVar3) {
      client->error = MQTT_OK;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    (*client->reconnect_callback)(client,&client->reconnect_state);
    bVar3 = true;
    if (client->error != MQTT_OK) {
      client->error = MQTT_ERROR_RECONNECT_FAILED;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (client->error != MQTT_OK) {
        return client->error;
      }
    }
  }
  if (client->inspector_callback != (_func_MQTTErrors_mqtt_client_ptr *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    MVar1 = (*client->inspector_callback)(client);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (MVar1 != MQTT_OK) {
      return MVar1;
    }
  }
  sVar2 = __mqtt_recv(client);
  MVar1 = (MQTTErrors)sVar2;
  if (MVar1 == MQTT_OK) {
    sVar2 = __mqtt_send(client);
    MVar1 = (MQTTErrors)sVar2;
    if ((!bVar3) && (client->reconnect_callback != (_func_void_mqtt_client_ptr_void_ptr_ptr *)0x0))
    {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      (*client->reconnect_callback)(client,&client->reconnect_state);
    }
  }
  return MVar1;
}

Assistant:

enum MQTTErrors mqtt_sync(struct mqtt_client *client) {
    /* Recover from any errors */
    enum MQTTErrors err;
    int reconnecting = 0;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);
    if (client->error != MQTT_ERROR_RECONNECTING && client->error != MQTT_OK && client->reconnect_callback != NULL) {
        client->reconnect_callback(client, &client->reconnect_state);
        if (client->error != MQTT_OK) {
            client->error = MQTT_ERROR_RECONNECT_FAILED;

            /* normally unlocked during CONNECT */
            MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
        }
        err = client->error;

        if (err != MQTT_OK) return err;
    } else {
        /* mqtt_reconnect will have queued the disconnect packet - that needs to be sent and then call reconnect */
        if (client->error == MQTT_ERROR_RECONNECTING) {
            reconnecting = 1;
            client->error = MQTT_OK;
        }
        MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    }

    /* Call inspector callback if necessary */
    
    if (client->inspector_callback != NULL) {
        MQTT_PAL_MUTEX_LOCK(&client->mutex);
        err = client->inspector_callback(client);
        MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
        if (err != MQTT_OK) return err;
    }

    /* Call receive */
    err = (enum MQTTErrors)__mqtt_recv(client);
    if (err != MQTT_OK) return err;

    /* Call send */
    err = (enum MQTTErrors)__mqtt_send(client);

    /* mqtt_reconnect will essentially be a disconnect if there is no callback */
    if (reconnecting && client->reconnect_callback != NULL) {
        MQTT_PAL_MUTEX_LOCK(&client->mutex);
        client->reconnect_callback(client, &client->reconnect_state);
    }

    return err;
}